

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void console<int,unsigned_int>(char *format,int *args,uint *args_1)

{
  if (console_mode != '\0') {
    printf("\x1b[m");
    printf("[CONSOLE] ");
    printf(format,(ulong)(uint)*args,(ulong)*args_1);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void console(const char *format, Args const & ... args){
    if(console_mode == 0){
        return;
    }
    printf("\e[m");
    printf("[CONSOLE] ");
    printf(format, args ...);
    printf("\n");
}